

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase193::run(TestCase193 *this)

{
  Reader brand;
  bool bVar1;
  uint64_t uVar2;
  ArrayPtr<const_char> AVar3;
  Reader local_390;
  ArrayPtr<const_char> local_360;
  Schema local_350;
  Reader local_348;
  ArrayPtr<const_char> local_318;
  bool local_301;
  undefined1 local_300 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_2d0;
  Schema local_2c0;
  Reader local_2b8;
  ArrayPtr<const_char> local_288;
  ArrayPtr<const_char> local_278;
  undefined1 local_268 [8];
  DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> _kjCondition_1;
  Reader local_228;
  String local_1f8;
  Schema local_1e0;
  Reader local_1d8;
  String local_1a8;
  bool local_189;
  undefined1 local_188 [7];
  bool _kj_shouldLog;
  String local_158;
  Schema local_140;
  Reader local_138;
  String local_108;
  DebugExpression<kj::String> local_f0;
  undefined1 local_d8 [8];
  DebugComparison<kj::String,_kj::String> _kjCondition;
  Reader local_88;
  Schema local_58;
  Schema local_50;
  StructSchema schema;
  undefined1 local_38 [8];
  SchemaLoader loader;
  TestCase193 *this_local;
  
  loader.impl.value.ptr = (Impl *)this;
  SchemaLoader::SchemaLoader((SchemaLoader *)local_38);
  SchemaLoader::loadCompiledTypeAndDependencies<capnproto_test::capnp::test::TestOldVersion>
            ((SchemaLoader *)local_38);
  uVar2 = typeId<capnproto_test::capnp::test::TestOldVersion,capnproto_test::capnp::test::TestOldVersion::_capnpPrivate>
                    ();
  local_88._reader.dataSize = 0;
  local_88._reader.pointerCount = 0;
  local_88._reader._38_2_ = 0;
  local_88._reader.nestingLimit = 0;
  local_88._reader._44_4_ = 0;
  local_88._reader.data = (void *)0x0;
  local_88._reader.pointers = (WirePointer *)0x0;
  local_88._reader.segment = (SegmentReader *)0x0;
  local_88._reader.capTable = (CapTableReader *)0x0;
  capnp::schema::Brand::Reader::Reader(&local_88);
  Schema::Schema((Schema *)&_kjCondition.result);
  brand._reader.capTable = local_88._reader.capTable;
  brand._reader.segment = local_88._reader.segment;
  brand._reader.data = local_88._reader.data;
  brand._reader.pointers = local_88._reader.pointers;
  brand._reader.dataSize = local_88._reader.dataSize;
  brand._reader.pointerCount = local_88._reader.pointerCount;
  brand._reader._38_2_ = local_88._reader._38_2_;
  brand._reader.nestingLimit = local_88._reader.nestingLimit;
  brand._reader._44_4_ = local_88._reader._44_4_;
  local_58 = SchemaLoader::get((SchemaLoader *)local_38,uVar2,brand,(Schema)_kjCondition._64_8_);
  local_50.raw = (RawBrandedSchema *)Schema::asStruct(&local_58);
  local_140.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestOldVersion>();
  Schema::getProto(&local_138,&local_140);
  kj::str<capnp::schema::Node::Reader>(&local_108,&local_138);
  kj::_::DebugExpressionStart::operator<<
            (&local_f0,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_108);
  Schema::getProto((Reader *)local_188,&local_50);
  kj::str<capnp::schema::Node::Reader>(&local_158,(Reader *)local_188);
  kj::_::DebugExpression<kj::String>::operator==
            ((DebugComparison<kj::String,_kj::String> *)local_d8,&local_f0,&local_158);
  kj::String::~String(&local_158);
  kj::_::DebugExpression<kj::String>::~DebugExpression(&local_f0);
  kj::String::~String(&local_108);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_d8);
  if (!bVar1) {
    local_189 = kj::_::Debug::shouldLog(ERROR);
    while (local_189 != false) {
      local_1e0.raw =
           (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestOldVersion>();
      Schema::getProto(&local_1d8,&local_1e0);
      kj::str<capnp::schema::Node::Reader>(&local_1a8,&local_1d8);
      Schema::getProto(&local_228,&local_50);
      kj::str<capnp::schema::Node::Reader>(&local_1f8,&local_228);
      kj::_::Debug::
      log<char_const(&)[108],kj::_::DebugComparison<kj::String,kj::String>&,kj::String,kj::String>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0xc9,ERROR,
                 "\"failed: expected \" \"(kj::str(Schema::from<test::TestOldVersion>().getProto())) == (kj::str(schema.getProto()))\", _kjCondition, kj::str(Schema::from<test::TestOldVersion>().getProto()), kj::str(schema.getProto())"
                 ,(char (*) [108])
                  "failed: expected (kj::str(Schema::from<test::TestOldVersion>().getProto())) == (kj::str(schema.getProto()))"
                 ,(DebugComparison<kj::String,_kj::String> *)local_d8,&local_1a8,&local_1f8);
      kj::String::~String(&local_1f8);
      kj::String::~String(&local_1a8);
      local_189 = false;
    }
  }
  kj::_::DebugComparison<kj::String,_kj::String>::~DebugComparison
            ((DebugComparison<kj::String,_kj::String> *)local_d8);
  uVar2 = typeId<capnproto_test::capnp::test::TestOldVersion,capnproto_test::capnp::test::TestOldVersion::_capnpPrivate>
                    ();
  _kjCondition_1._48_8_ =
       loadUnderAlternateTypeId<capnproto_test::capnp::test::TestNewVersion>
                 ((SchemaLoader *)local_38,uVar2);
  local_2c0.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestNewVersion>();
  Schema::getProto(&local_2b8,&local_2c0);
  local_288 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_2b8);
  local_278 = (ArrayPtr<const_char>)
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Reader *)&local_288);
  Schema::getProto((Reader *)local_300,&local_50);
  local_2d0 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName((Reader *)local_300)
  ;
  kj::_::DebugExpression<capnp::Text::Reader>::operator==
            ((DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)local_268,
             (DebugExpression<capnp::Text::Reader> *)&local_278,(Reader *)&local_2d0);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_268);
  if (!bVar1) {
    local_301 = kj::_::Debug::shouldLog(ERROR);
    while (local_301 != false) {
      local_350.raw =
           (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestNewVersion>();
      Schema::getProto(&local_348,&local_350);
      AVar3 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_348);
      local_318 = AVar3;
      Schema::getProto(&local_390,&local_50);
      AVar3 = (ArrayPtr<const_char>)capnp::schema::Node::Reader::getDisplayName(&local_390);
      local_360 = AVar3;
      kj::_::Debug::
      log<char_const(&)[124],kj::_::DebugComparison<capnp::Text::Reader,capnp::Text::Reader>&,capnp::Text::Reader,capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader-test.c++"
                 ,0xcf,ERROR,
                 "\"failed: expected \" \"(Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())\", _kjCondition, Schema::from<test::TestNewVersion>().getProto().getDisplayName(), schema.getProto().getDisplayName()"
                 ,(char (*) [124])
                  "failed: expected (Schema::from<test::TestNewVersion>().getProto().getDisplayName()) == (schema.getProto().getDisplayName())"
                 ,(DebugComparison<capnp::Text::Reader,_capnp::Text::Reader> *)local_268,
                 (Reader *)&local_318,(Reader *)&local_360);
      local_301 = false;
    }
  }
  Schema::requireUsableAs<capnproto_test::capnp::test::TestOldVersion>(&local_50);
  SchemaLoader::~SchemaLoader((SchemaLoader *)local_38);
  return;
}

Assistant:

TEST(SchemaLoader, Upgrade) {
  SchemaLoader loader;

  loader.loadCompiledTypeAndDependencies<test::TestOldVersion>();

  StructSchema schema = loader.get(typeId<test::TestOldVersion>()).asStruct();

  EXPECT_EQ(kj::str(Schema::from<test::TestOldVersion>().getProto()),
            kj::str(schema.getProto()));

  loadUnderAlternateTypeId<test::TestNewVersion>(loader, typeId<test::TestOldVersion>());

  // The new version replaced the old.
  EXPECT_EQ(Schema::from<test::TestNewVersion>().getProto().getDisplayName(),
            schema.getProto().getDisplayName());

  // But it is still usable as the old version.
  schema.requireUsableAs<test::TestOldVersion>();
}